

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_encode_options<char>::basic_json_encode_options
          (basic_json_encode_options<char> *this)

{
  basic_json_options_common<char>::basic_json_options_common
            ((basic_json_options_common<char> *)&this->field_0x40);
  this->_vptr_basic_json_encode_options = (_func_int **)0x997c38;
  *(undefined8 *)&this->field_0x40 = 0x997c60;
  this->field_0x8 = this->field_0x8 & 0xf0;
  this->float_format_ = general;
  this->byte_string_format_ = none;
  this->bignum_format_ = number;
  this->line_splits_ = multi_line;
  this->object_object_line_splits_ = 0;
  this->object_array_line_splits_ = 0;
  this->array_array_line_splits_ = 0;
  this->array_object_line_splits_ = 0;
  this->spaces_around_colon_ = space_after;
  this->spaces_around_comma_ = space_after;
  this->precision_ = '\0';
  this->indent_size_ = '\x04';
  this->line_length_limit_ = 0x78;
  (this->new_line_chars_)._M_dataplus._M_p = (pointer)&(this->new_line_chars_).field_2;
  (this->new_line_chars_)._M_string_length = 0;
  (this->new_line_chars_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)this + ' ');
  return;
}

Assistant:

basic_json_encode_options()
        : escape_all_non_ascii_(false),
          escape_solidus_(false),
          pad_inside_object_braces_(false),
          pad_inside_array_brackets_(false),
          float_format_(float_chars_format::general),
          byte_string_format_(byte_string_chars_format::none),
          bignum_format_(bignum_format_kind::raw),
          line_splits_(line_split_kind::multi_line),
          object_object_line_splits_(line_split_kind{}),
          object_array_line_splits_(line_split_kind{}),
          array_array_line_splits_(line_split_kind{}),
          array_object_line_splits_(line_split_kind{}),
          spaces_around_colon_(spaces_option::space_after),
          spaces_around_comma_(spaces_option::space_after)
    {
        new_line_chars_.push_back('\n');
    }